

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

void AM_showSS(void)

{
  subsector_t *psVar1;
  byte bVar2;
  FPolyNode *pFVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  AMColor red;
  AMColor yellow;
  AMColor local_40;
  AMColor local_38;
  
  if ((-1 < am_showsubsector.Value) && (am_showsubsector.Value < numsubsectors)) {
    local_38.RGB = 0xffffff00;
    bVar2 = FColorMatcher::Pick(&ColorMatcher,0xff,0xff,0);
    local_38.Index = (int)bVar2;
    local_40.RGB = 0xffff0000;
    bVar2 = FColorMatcher::Pick(&ColorMatcher,0xff,0,0);
    local_40.Index = (int)bVar2;
    psVar1 = subsectors + am_showsubsector.Value;
    if (subsectors[am_showsubsector.Value].numlines != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        AM_drawSeg((seg_t *)((long)&psVar1->firstline->v1 + lVar5),&local_38);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x48;
      } while (uVar4 < psVar1->numlines);
    }
    PO_LinkToSubsectors();
    if (0 < po_NumPolyobjs) {
      lVar5 = 0;
      do {
        for (pFVar3 = polyobjs[lVar5].subsectorlinks; pFVar3 != (FPolyNode *)0x0;
            pFVar3 = pFVar3->snext) {
          if ((pFVar3->subsector == psVar1) && ((pFVar3->segs).Count != 0)) {
            lVar6 = 0;
            uVar4 = 0;
            do {
              AM_drawPolySeg((FPolySeg *)((long)&(((pFVar3->segs).Array)->v1).pos.X + lVar6),
                             &local_40);
              uVar4 = uVar4 + 1;
              lVar6 = lVar6 + 0x28;
            } while (uVar4 < (pFVar3->segs).Count);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < po_NumPolyobjs);
    }
  }
  return;
}

Assistant:

inline operator int () const { return Value; }